

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.hpp
# Opt level: O2

container<pstore::repo::external_fixup> __thiscall
pstore::repo::debug_line_dispatcher::xfixups(debug_line_dispatcher *this)

{
  container<pstore::repo::external_fixup> cVar1;
  
  cVar1 = generic_section::xfixups(&this->d_->g_);
  return cVar1;
}

Assistant:

container<external_fixup> xfixups () const final { return d_.xfixups (); }